

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void DC16NoTop_C(uint8_t *dst)

{
  long in_RDI;
  int j;
  int DC;
  uint8_t *in_stack_ffffffffffffffe8;
  undefined4 local_10;
  int v;
  
  v = 8;
  for (local_10 = 0; local_10 < 0x10; local_10 = local_10 + 1) {
    v = (uint)*(byte *)(in_RDI + (local_10 * 0x20 + -1)) + v;
  }
  Put16(v,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void DC16NoTop_C(uint8_t* dst) {   // DC with top samples not available
  int DC = 8;
  int j;
  for (j = 0; j < 16; ++j) {
    DC += dst[-1 + j * BPS];
  }
  Put16(DC >> 4, dst);
}